

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::ProcessPresetEnvironment(cmake *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined8 local_80;
  undefined1 *local_78;
  _Base_ptr local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  p_Var1 = (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  p_Var2 = &(this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      if ((char)p_Var1[3]._M_color == _S_black) {
        local_90._M_str = *(char **)(p_Var1 + 1);
        local_90._M_len = (size_t)p_Var1[1]._M_parent;
        local_60 = 1;
        local_50[0] = 0x3d;
        local_80 = 1;
        local_68 = *(undefined8 *)(p_Var1 + 2);
        local_70 = p_Var1[2]._M_parent;
        views._M_len = 3;
        views._M_array = &local_90;
        local_78 = local_50;
        local_58 = local_50;
        cmCatViews_abi_cxx11_(&local_b0,views);
        cmsys::SystemTools::PutEnv(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void cmake::ProcessPresetEnvironment()
{
  for (auto const& var : this->UnprocessedPresetEnvironment) {
    if (var.second) {
      cmSystemTools::PutEnv(cmStrCat(var.first, '=', *var.second));
    }
  }
}